

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O3

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkFor
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeFor *pnode,Context context)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (**(this->super_WalkerPolicyTest).
             super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
             _vptr_WalkerPolicyBase)(this,pnode->pnodeInit);
  uVar1 = (undefined1)iVar3;
  bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
  if (bVar2) {
    iVar3 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pnode->pnodeCond,context);
    uVar1 = (undefined1)iVar3;
    bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (bVar2) {
      iVar3 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pnode->pnodeIncr,context);
      uVar1 = (undefined1)iVar3;
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (bVar2) {
        bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
        uVar1 = 1;
        if (bVar2) {
          iVar3 = (**(this->super_WalkerPolicyTest).
                     super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                     _vptr_WalkerPolicyBase)(this,pnode->pnodeBody,context);
          return SUB41(iVar3,0);
        }
      }
    }
  }
  return (ResultType)uVar1;
}

Assistant:

ResultType WalkFor(ParseNodeFor *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnodeInit, context);
        if (ContinueWalk(result))
        {
            result = WalkNthChild(pnode, pnode->pnodeCond, context);
            if (ContinueWalk(result))
            {
                result = WalkNthChild(pnode, pnode->pnodeIncr, context);
                if (ContinueWalk(result))
                {
                    result = WalkNode(pnode, context);
                    if (ContinueWalk(result))
                    {
                        result = WalkSecondChild(pnode->pnodeBody, context);
                    }
                }
            }
        }
        return result;
    }